

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGuiStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiInputTextState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  uint uVar1;
  int iVar2;
  unsigned_short *puVar3;
  bool bVar4;
  int iVar5;
  unsigned_short *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  uVar1 = obj->UserFlags;
  iVar2 = obj->CurLenW;
  lVar10 = (long)new_text_len;
  iVar5 = ImTextCountUtf8BytesFromStr(new_text,new_text + lVar10);
  if (((uVar1 >> 0x12 & 1) == 0) && (obj->BufCapacityA <= obj->CurLenA + iVar5)) {
LAB_00155723:
    bVar4 = false;
  }
  else {
    if ((obj->TextW).Size <= new_text_len + iVar2) {
      if ((uVar1 >> 0x12 & 1) == 0) goto LAB_00155723;
      iVar7 = 0x100;
      if (0x100 < new_text_len) {
        iVar7 = new_text_len;
      }
      if (new_text_len * 4 < iVar7) {
        iVar7 = new_text_len * 4;
      }
      iVar9 = 0x20;
      if (7 < new_text_len) {
        iVar9 = iVar7;
      }
      iVar8 = iVar9 + iVar2 + 1;
      iVar7 = (obj->TextW).Capacity;
      if (iVar7 <= iVar9 + iVar2) {
        if (iVar7 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar7 / 2 + iVar7;
        }
        if (iVar9 <= iVar8) {
          iVar9 = iVar8;
        }
        if (iVar7 < iVar9) {
          puVar6 = (unsigned_short *)ImGui::MemAlloc((long)iVar9 * 2);
          puVar3 = (obj->TextW).Data;
          if (puVar3 != (unsigned_short *)0x0) {
            memcpy(puVar6,puVar3,(long)(obj->TextW).Size * 2);
            ImGui::MemFree((obj->TextW).Data);
          }
          (obj->TextW).Data = puVar6;
          (obj->TextW).Capacity = iVar9;
        }
      }
      (obj->TextW).Size = iVar8;
    }
    puVar3 = (obj->TextW).Data;
    if (iVar2 - pos != 0) {
      puVar6 = puVar3 + pos;
      memmove(puVar6 + lVar10,puVar6,(long)(iVar2 - pos) * 2);
    }
    memcpy(puVar3 + pos,new_text,lVar10 * 2);
    lVar10 = obj->CurLenW + lVar10;
    obj->CurLenW = (int)lVar10;
    obj->CurLenA = obj->CurLenA + iVar5;
    (obj->TextW).Data[lVar10] = 0;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(STB_TEXTEDIT_STRING* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const bool is_resizable = (obj->UserFlags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (!is_resizable && (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufCapacityA))
        return false;

    // Grow internal buffer if needed
    if (new_text_len + text_len + 1 > obj->TextW.Size)
    {
        if (!is_resizable)
            return false;
        IM_ASSERT(text_len < obj->TextW.Size);
        obj->TextW.resize(text_len + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1);
    }

    ImWchar* text = obj->TextW.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->TextW[obj->CurLenW] = '\0';

    return true;
}